

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_uniform(tgestate_t *state)

{
  long in_RDI;
  spritedef_t *guard_sprite;
  
  if ((*(long *)(in_RDI + 1000) != 0x1239c0) && (*(byte *)(in_RDI + 0x120) < 0x1d)) {
    *(undefined8 *)(in_RDI + 1000) = 0x1239c0;
    increase_morale_by_10_score_by_50((tgestate_t *)0x10856e);
  }
  return;
}

Assistant:

void action_uniform(tgestate_t *state)
{
  const spritedef_t *guard_sprite; /* was HL */

  assert(state != NULL);

  guard_sprite = &sprites[sprite_GUARD_FACING_AWAY_1];

  if (state->vischars[0].mi.sprite == guard_sprite)
    return; /* Already in uniform. */

  if (state->room_index >= room_29_SECOND_TUNNEL_START)
    return; /* Can't don uniform when in a tunnel. */

  state->vischars[0].mi.sprite = guard_sprite;

  increase_morale_by_10_score_by_50(state);
}